

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::JavascriptProxy::GetEnumerator::ProxyOwnkeysEnumerator::MoveAndGetNext
          (ProxyOwnkeysEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type *element;
  uint uVar1;
  uint uVar2;
  JavascriptArray *pJVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  uint extraout_var;
  JavascriptString *pJVar7;
  char16 *pcVar8;
  Var aValue;
  undefined1 local_80 [8];
  PropertyDescriptor desc;
  CharacterBuffer<char16_t> propertyString;
  RecyclableObject *obj;
  
  *propertyId = -1;
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  uVar1 = (((this->trapResult).ptr)->super_ArrayObject).length;
  uVar2 = this->index;
  if (uVar2 < uVar1) {
    element = &desc.Configurable;
    do {
      pJVar3 = (this->trapResult).ptr;
      this->index = uVar2 + 1;
      iVar5 = (*(pJVar3->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])();
      obj = (RecyclableObject *)CONCAT44(extraout_var,iVar5);
      if ((extraout_var >> 0x10 == 0 && obj != (RecyclableObject *)0x0) &&
         (bVar4 = VarIsImpl<Js::JavascriptString>(obj), bVar4)) {
        pJVar7 = VarTo<Js::JavascriptString>(obj);
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_80);
        BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)(this->proxy).ptr,pJVar7,this->scriptContext,
                           (PropertyDescriptor *)local_80);
        pcVar8 = JavascriptString::GetString(pJVar7);
        JavascriptString::GetLength(pJVar7);
        Memory::Recycler::WBSetBit(element);
        desc._40_8_ = pcVar8;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(element);
        if ((BVar6 != 0) &&
           (bVar4 = JsUtil::
                    BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    ::Contains((this->visited).ptr,(CharacterBuffer<char16_t> *)element), !bVar4)) {
          JsUtil::
          BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Add((this->visited).ptr,(CharacterBuffer<char16_t> *)element);
          bVar4 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_80);
          if (bVar4) {
            aValue = CrossSite::MarshalVar
                               (this->scriptContext,pJVar7,
                                (((((pJVar7->super_RecyclableObject).type.ptr)->javascriptLibrary).
                                 ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
            pJVar7 = VarTo<Js::JavascriptString>(aValue);
            return pJVar7;
          }
        }
      }
      uVar2 = this->index;
    } while (uVar2 < uVar1);
  }
  return (JavascriptString *)0x0;
}

Assistant:

virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
            {
                propertyId = Constants::NoProperty;
                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }
                // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
                // for (let key of Reflect.ownKeys(obj)) {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++) ;
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(proxy, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                      scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
                return nullptr;
            }